

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

void __thiscall
adios2sys::RegularExpression::RegularExpression(RegularExpression *this,RegularExpression *rxp)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  void *in_RSI;
  void *in_RDI;
  ulong uVar4;
  char *dum;
  int ind;
  RegularExpressionMatch *in_stack_ffffffffffffffe0;
  undefined4 local_14;
  
  RegularExpressionMatch::RegularExpressionMatch(in_stack_ffffffffffffffe0);
  if (*(long *)((long)in_RSI + 0x220) == 0) {
    *(undefined8 *)((long)in_RDI + 0x220) = 0;
  }
  else {
    *(undefined4 *)((long)in_RDI + 0x228) = *(undefined4 *)((long)in_RSI + 0x228);
    uVar4 = (ulong)*(int *)((long)in_RDI + 0x228);
    if ((long)uVar4 < 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pvVar1 = operator_new__(uVar4);
    *(void **)((long)in_RDI + 0x220) = pvVar1;
    local_14 = *(int *)((long)in_RDI + 0x228);
    while (iVar3 = local_14 + -1, local_14 != 0) {
      *(undefined1 *)(*(long *)((long)in_RDI + 0x220) + (long)iVar3) =
           *(undefined1 *)(*(long *)((long)in_RSI + 0x220) + (long)iVar3);
      local_14 = iVar3;
    }
    memcpy(in_RDI,in_RSI,0x208);
    *(undefined8 *)((long)in_RDI + 0x210) = *(undefined8 *)((long)in_RSI + 0x210);
    if (*(long *)((long)in_RSI + 0x210) != 0) {
      lVar2 = *(long *)((long)in_RSI + 0x220);
      local_14 = 0;
      for (; lVar2 != *(long *)((long)in_RSI + 0x210); lVar2 = lVar2 + 1) {
        local_14 = local_14 + 1;
      }
      *(long *)((long)in_RDI + 0x210) = *(long *)((long)in_RDI + 0x220) + (long)local_14;
    }
    *(undefined1 *)((long)in_RDI + 0x208) = *(undefined1 *)((long)in_RSI + 0x208);
    *(undefined1 *)((long)in_RDI + 0x209) = *(undefined1 *)((long)in_RSI + 0x209);
    *(undefined8 *)((long)in_RDI + 0x218) = *(undefined8 *)((long)in_RSI + 0x218);
  }
  return;
}

Assistant:

RegularExpression::RegularExpression(const RegularExpression& rxp)
{
  if (!rxp.program) {
    this->program = nullptr;
    return;
  }
  int ind;
  this->progsize = rxp.progsize;            // Copy regular expression size
  this->program = new char[this->progsize]; // Allocate storage
  for (ind = this->progsize; ind-- != 0;)   // Copy regular expression
    this->program[ind] = rxp.program[ind];
  // Copy pointers into last successful "find" operation
  this->regmatch = rxp.regmatch;
  this->regmust = rxp.regmust; // Copy field
  if (rxp.regmust) {
    char* dum = rxp.program;
    ind = 0;
    while (dum != rxp.regmust) {
      ++dum;
      ++ind;
    }
    this->regmust = this->program + ind;
  }
  this->regstart = rxp.regstart; // Copy starting index
  this->reganch = rxp.reganch;   // Copy remaining private data
  this->regmlen = rxp.regmlen;   // Copy remaining private data
}